

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

int __thiscall JetHead::Socket::getLocalAddress(Socket *this,Address *addr)

{
  int iVar1;
  socklen_t sVar2;
  socklen_t sock_len;
  sockaddr_in sock_addr;
  sa_family_t local_44;
  in_port_t local_42;
  in_addr_t local_40;
  
  sock_len = 0x10;
  iVar1 = getsockname(this->mFd,(sockaddr *)&sock_addr,&sock_len);
  sVar2 = sock_len;
  if (iVar1 == 0) {
    memcpy(&local_44,&sock_addr,(long)(int)sock_len);
  }
  else {
    sVar2 = 0x10;
    local_40 = 0;
    local_44 = 2;
    local_42 = 0;
  }
  (addr->mAddr).sin_family = local_44;
  (addr->mAddr).sin_addr.s_addr = local_40;
  (addr->mAddr).sin_port = local_42;
  addr->mLen = sVar2;
  return iVar1;
}

Assistant:

int Socket::getLocalAddress( Socket::Address &addr )
{
	struct sockaddr_in sock_addr;
	socklen_t sock_len = sizeof( sock_addr );
	
	int res = getsockname( mFd, (struct sockaddr*)&sock_addr, &sock_len );
	
	if ( res == 0 )
	{
		addr = Socket::Address( &sock_addr, sock_len );
	}
	else
	{
		addr = Socket::Address();
	}
	
	return res;
}